

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O3

void gdImageCopyMergeGray
               (gdImagePtr dst,gdImagePtr src,int dstX,int dstY,int srcX,int srcY,int w,int h,
               int pct)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  uint uVar6;
  uint uVar7;
  int b;
  int r;
  int g;
  int x;
  int x_00;
  int local_74;
  
  if (0 < h) {
    fVar2 = (float)pct / 100.0;
    fVar5 = (float)-(pct + -100) / 100.0;
    local_74 = srcY;
    do {
      x = dstX;
      x_00 = srcX;
      if (0 < w) {
        do {
          uVar6 = gdImageGetPixel(src,x_00,local_74);
          if (src->transparent != uVar6) {
            if (pct + -100 != 0 || dst != src) {
              uVar7 = gdImageGetPixel(dst,x,dstY);
              if (dst->trueColor == 0) {
                fVar1 = (float)dst->red[(int)uVar7] * 0.299 + (float)dst->green[(int)uVar7] * 0.587;
                uVar7 = dst->blue[(int)uVar7];
              }
              else {
                fVar1 = (float)(uVar7 >> 0x10 & 0xff) * 0.299 + (float)(uVar7 >> 8 & 0xff) * 0.587;
                uVar7 = uVar7 & 0xff;
              }
              fVar1 = (float)(int)uVar7 * 0.114 + fVar1;
              if (src->trueColor == 0) {
                fVar4 = (float)src->red[(int)uVar6] * fVar2 + fVar1 * fVar5;
                fVar3 = (float)src->green[(int)uVar6] * fVar2 + fVar1 * fVar5;
                uVar6 = src->blue[(int)uVar6];
              }
              else {
                fVar4 = (float)(uVar6 >> 0x10 & 0xff) * fVar2 + fVar1 * fVar5;
                fVar3 = (float)(uVar6 >> 8 & 0xff) * fVar2 + fVar1 * fVar5;
                uVar6 = uVar6 & 0xff;
              }
              r = (int)fVar4;
              g = (int)fVar3;
              b = (int)((float)(int)uVar6 * fVar2 + fVar1 * fVar5);
              uVar6 = gdImageColorExactAlpha(dst,r,g,b,0);
              if ((uVar6 == 0xffffffff) &&
                 (uVar6 = gdImageColorAllocateAlpha(dst,r,g,b,0), uVar6 == 0xffffffff)) {
                uVar6 = gdImageColorClosestAlpha(dst,r,g,b,0);
              }
            }
            gdImageSetPixel(dst,x,dstY,uVar6);
          }
          x_00 = x_00 + 1;
          x = x + 1;
        } while (x_00 < w + srcX);
      }
      dstY = dstY + 1;
      local_74 = local_74 + 1;
    } while (local_74 < h + srcY);
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageCopyMergeGray (gdImagePtr dst, gdImagePtr src, int dstX, int dstY,
										int srcX, int srcY, int w, int h, int pct)
{

	int c, dc;
	int x, y;
	int tox, toy;
	int ncR, ncG, ncB;
	float g;
	toy = dstY;
	for (y = srcY; (y < (srcY + h)); y++) {
		tox = dstX;
		for (x = srcX; (x < (srcX + w)); x++) {
			int nc;
			c = gdImageGetPixel (src, x, y);
			/* Added 7/24/95: support transparent copies */
			if (gdImageGetTransparent (src) == c) {
				tox++;
				continue;
			}
			/*
			 * If it's the same image, mapping is NOT trivial since we
			 * merge with greyscale target, but if pct is 100, the grey
			 * value is not used, so it becomes trivial. pjw 2.0.12.
			 */
			if (dst == src && pct == 100) {
				nc = c;
			} else {
				dc = gdImageGetPixel (dst, tox, toy);
				g = 0.29900 * gdImageRed(dst, dc)
				    + 0.58700 * gdImageGreen(dst, dc) + 0.11400 * gdImageBlue(dst, dc);

				ncR = gdImageRed (src, c) * (pct / 100.0)
				      + g * ((100 - pct) / 100.0);
				ncG = gdImageGreen (src, c) * (pct / 100.0)
				      + g * ((100 - pct) / 100.0);
				ncB = gdImageBlue (src, c) * (pct / 100.0)
				      + g * ((100 - pct) / 100.0);

				/* First look for an exact match */
				nc = gdImageColorExact (dst, ncR, ncG, ncB);
				if (nc == (-1)) {
					/* No, so try to allocate it */
					nc = gdImageColorAllocate (dst, ncR, ncG, ncB);
					/* If we're out of colors, go for the
					   closest color */
					if (nc == (-1)) {
						nc = gdImageColorClosest (dst, ncR, ncG, ncB);
					}
				}
			}
			gdImageSetPixel (dst, tox, toy, nc);
			tox++;
		}
		toy++;
	}
}